

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O3

LogMessage * __thiscall
absl::lts_20250127::log_internal::LogMessage::ToSinkAlso
          (LogMessage *this,Nonnull<absl::LogSink_*> sink)

{
  string death_message;
  long *local_60 [2];
  long local_50 [2];
  Nonnull<absl::LogSink_*> local_40;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  local_40 = sink;
  if (sink != (Nonnull<absl::LogSink_*>)0x0) {
    inlined_vector_internal::
    Storage<absl::lts_20250127::LogSink*,16ul,std::allocator<absl::lts_20250127::LogSink*>>::
    EmplaceBack<absl::lts_20250127::LogSink*const&>
              ((Storage<absl::lts_20250127::LogSink*,16ul,std::allocator<absl::lts_20250127::LogSink*>>
                *)&((this->data_)._M_t.
                    super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                    .
                    super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                   ._M_head_impl)->extra_sinks,&local_40);
    return this;
  }
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"Check sink failed: ","");
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"null LogSink*","");
  std::__cxx11::string::_M_append((char *)local_38,(ulong)local_60[0]);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
            (3,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/log/internal/log_message.cc"
             ,0x163,local_38);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/log/internal/log_message.cc"
                ,0x163,
                "LogMessage &absl::log_internal::LogMessage::ToSinkAlso(absl::Nonnull<absl::LogSink *>)"
               );
}

Assistant:

LogMessage& LogMessage::ToSinkAlso(absl::Nonnull<absl::LogSink*> sink) {
  ABSL_INTERNAL_CHECK(sink, "null LogSink*");
  data_->extra_sinks.push_back(sink);
  return *this;
}